

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mu_law_compression.cc
# Opt level: O0

bool __thiscall sptk::MuLawCompression::Run(MuLawCompression *this,double input,double *output)

{
  double dVar1;
  int iVar2;
  double *in_RSI;
  long in_RDI;
  double in_XMM0_Qa;
  double dVar3;
  double x;
  undefined1 local_1;
  
  if (((*(byte *)(in_RDI + 0x20) & 1) == 0) || (in_RSI == (double *)0x0)) {
    local_1 = false;
  }
  else {
    dVar3 = *(double *)(in_RDI + 8);
    dVar1 = *(double *)(in_RDI + 0x18);
    iVar2 = ExtractSign(in_XMM0_Qa);
    dVar3 = log1p(*(double *)(in_RDI + 0x10) * (ABS(in_XMM0_Qa) / dVar3));
    *in_RSI = dVar1 * (double)iVar2 * dVar3;
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool MuLawCompression::Run(double input, double* output) const {
  if (!is_valid_ || NULL == output) {
    return false;
  }

  const double x(std::fabs(input) / abs_max_value_);
  *output = (constant_ * sptk::ExtractSign(input) *
             std::log1p(compression_factor_ * x));

  return true;
}